

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<unsigned_long,_2U>::SmallVector
          (SmallVector<unsigned_long,_2U> *this,SmallVector<unsigned_long,_2U> *RHS)

{
  bool bVar1;
  SmallVector<unsigned_long,_2U> *RHS_local;
  SmallVector<unsigned_long,_2U> *this_local;
  
  SmallVectorImpl<unsigned_long>::SmallVectorImpl(&this->super_SmallVectorImpl<unsigned_long>,2);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<unsigned_long>::operator=
              (&this->super_SmallVectorImpl<unsigned_long>,
               &RHS->super_SmallVectorImpl<unsigned_long>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }